

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.h
# Opt level: O0

string * absl::StrCat<std::__cxx11::string>
                   (string_view first,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rest)

{
  string_view str;
  string_view str_00;
  string *in_RCX;
  char *in_RSI;
  string *in_RDI;
  string local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa0;
  string local_40 [32];
  string *local_20;
  
  str._M_str = in_RSI;
  str._M_len = in_stack_ffffffffffffffa0;
  local_20 = in_RCX;
  StrCat_abi_cxx11_(str);
  std::__cxx11::string::operator_cast_to_basic_string_view(local_20);
  str_00._M_str = in_RSI;
  str_00._M_len = in_stack_ffffffffffffffa0;
  StrCat_abi_cxx11_(str_00);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

inline std::string StrCat(absl::string_view first, const T &...rest) {
  return StrCat(first) + StrCat(rest...);
}